

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.cc
# Opt level: O2

void __thiscall S2CellIndex::RangeIterator::Seek(RangeIterator *this,S2CellId target)

{
  __normal_iterator<const_S2CellIndex::RangeNode_*,_std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>_>
  _Var1;
  S2CellId target_local;
  S2LogMessage local_18;
  
  target_local = target;
  if ((target.id_ & 1) != 0) {
    _Var1 = std::
            __upper_bound<__gnu_cxx::__normal_iterator<S2CellIndex::RangeNode_const*,std::vector<S2CellIndex::RangeNode,std::allocator<S2CellIndex::RangeNode>>>,S2CellId,__gnu_cxx::__ops::_Val_less_iter>
                      ((this->range_nodes_->
                       super__Vector_base<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (this->range_nodes_->
                       super__Vector_base<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>
                       )._M_impl.super__Vector_impl_data._M_finish,&target_local);
    (this->it_)._M_current = _Var1._M_current + -1;
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc"
             ,0x19,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_18.stream_,"Check failed: target.is_leaf() ");
  abort();
}

Assistant:

void S2CellIndex::RangeIterator::Seek(S2CellId target) {
  S2_DCHECK(target.is_leaf());
  it_ = std::upper_bound(range_nodes_->begin(), range_nodes_->end(),
                         target) - 1;
}